

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingDemo.cpp
# Opt level: O2

int main(void)

{
  AbstractLoggingDevice *this;
  AbstractFormatter *pAVar1;
  FileLogger *this_00;
  ostream *poVar2;
  allocator local_1f2;
  allocator local_1f1;
  allocator local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  ostringstream __stream__unique__;
  
  this = (AbstractLoggingDevice *)operator_new(0x10);
  pAVar1 = (AbstractFormatter *)operator_new(0x10);
  pAVar1->mNewLine = No;
  pAVar1->_vptr_AbstractFormatter = (_func_int **)&PTR__AbstractFormatter_00104cc8;
  SLogLib::ConsoleLogger::ConsoleLogger((ConsoleLogger *)this,pAVar1);
  SLogLib::addLoggingDevice(this);
  this_00 = (FileLogger *)operator_new(0x18);
  std::__cxx11::string::string((string *)&__stream__unique__,"foo.log",local_1f0);
  pAVar1 = (AbstractFormatter *)operator_new(0x10);
  pAVar1->mNewLine = No;
  pAVar1->_vptr_AbstractFormatter = (_func_int **)&PTR__AbstractFormatter_00104d68;
  SLogLib::FileLogger::FileLogger(this_00,(string *)&__stream__unique__,_S_app,Immediately,pAVar1);
  SLogLib::addLoggingDevice((AbstractLoggingDevice *)this_00);
  std::__cxx11::string::~string((string *)&__stream__unique__);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__stream__unique__);
  poVar2 = std::operator<<((ostream *)&__stream__unique__,"a = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
  std::operator<<(poVar2," b = ");
  std::ostream::_M_insert<double>(15.3);
  std::__cxx11::string::string
            ((string *)local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/saurabhg17[P]SLogLib/Examples/LoggingDemo/LoggingDemo.cpp"
             ,&local_1f1);
  std::__cxx11::string::string(local_1b0,"main",&local_1f2);
  std::__cxx11::stringbuf::str();
  SLogLib::writeMessage((string *)local_1f0,local_1b0,0x16,Info,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__stream__unique__);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__stream__unique__);
  std::operator<<((ostream *)&__stream__unique__,"Success");
  std::__cxx11::string::string
            ((string *)local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/saurabhg17[P]SLogLib/Examples/LoggingDemo/LoggingDemo.cpp"
             ,&local_1f1);
  std::__cxx11::string::string(local_1b0,"main",&local_1f2);
  std::__cxx11::stringbuf::str();
  SLogLib::writeMessage((string *)local_1f0,local_1b0,0x17,Info,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__stream__unique__);
  return 0;
}

Assistant:

int main()
{
	// Add these lines at the beginning of your program.
	// The devices and formatters are automatically deleted by SLogLib.
	using namespace SLogLib;
	addLoggingDevice(new ConsoleLogger(new NullFormatter));
	addLoggingDevice(new FileLogger("foo.log", std::ios_base::app, FileOpenFlag::Immediately, new DetailedFormatter));
	
	// The following line writes the message to both console and file.
	int a = 10;
	double b = 15.3;
	const char* c = "Success";
	SLOGLIB_LOG_MSG_INFO("a = " << a << " b = " << b);
	SLOGLIB_LOG_MSG_INFO(c);
	
	return 0;
}